

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

uint8_t get_image_version(FILE *fp)

{
  size_t sVar1;
  uint8_t ver;
  int rc;
  FILE *pFStack_18;
  uint8_t header [5];
  FILE *fp_local;
  
  pFStack_18 = (FILE *)fp;
  sVar1 = fread(&ver,5,1,(FILE *)fp);
  if ((int)sVar1 != 1) {
    error_impl("get_image_version",0x40b,"get_image_version(): Unable to read version header data!")
    ;
  }
  if ((((ver == 'l') && ((char)rc == 's')) && (rc._1_1_ == 't')) && (rc._2_1_ == '!')) {
    if (rc._3_1_ < 3) {
      fseek(pFStack_18,8,0);
    }
    fp_local._7_1_ = rc._3_1_;
  }
  else {
    fseek(pFStack_18,0,0);
    fp_local._7_1_ = 0;
  }
  return fp_local._7_1_;
}

Assistant:

uint8_t get_image_version(FILE *fp)
{
    uint8_t header[IMAGE_HEADER_SIZE];
    int rc;

    rc = (int)fread(&header, sizeof(header), 1, fp);

    if(rc != 1) {
        error("get_image_version(): Unable to read version header data!");
    }

    if(header[0] == 'l' && header[1] == 's' && header[2] == 't' && header[3] == '!') {
        uint8_t ver = header[4];

        if(ver <= IMAGE_VERSION_2) {
            /* old version, seek past the extra 3 bytes. */
            fseek(fp, IMAGE_HEADER_SIZE_OLD, SEEK_SET);
        }

        return ver;
    } else {
        /* not a version with a header, seek back to the start. */
        fseek(fp, 0, SEEK_SET);
        return 0;
    }
}